

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# add_benchmark.c
# Opt level: O3

void make_data(uint32_t spanlen,uint32_t intvlen,double density,order_t order,uint32_t **offsets_out
              ,uint32_t *count_out)

{
  uint32_t uVar1;
  uint32_t *puVar2;
  long lVar3;
  byte bVar4;
  uint uVar5;
  ulong uVar6;
  uint uVar7;
  ulong uVar8;
  ulong uVar9;
  uint uVar10;
  ulong uVar11;
  double dVar12;
  undefined1 auVar13 [16];
  
  dVar12 = floor((density * (double)spanlen) / (double)intvlen);
  uVar8 = (ulong)dVar12;
  uVar7 = (uint)uVar8;
  uVar6 = uVar8 & 0xffffffff;
  puVar2 = (uint32_t *)malloc(uVar6 * 4);
  if (uVar7 != 0) {
    uVar9 = 0;
    lVar3 = 0;
    uVar11 = pcg32_global_0;
    do {
      pcg32_global_0 = uVar11 * 0x5851f42d4c957f2d + 0xda3e39cb94b95bdb;
      uVar10 = (uint)(uVar11 >> 0x2d) ^ (uint)(uVar11 >> 0x1b);
      bVar4 = (byte)(uVar11 >> 0x3b);
      uVar10 = uVar10 >> bVar4 | uVar10 << 0x20 - bVar4;
      puVar2[uVar9] = uVar10;
      lVar3 = lVar3 + (ulong)uVar10;
      uVar9 = uVar9 + 1;
      uVar11 = pcg32_global_0;
    } while (uVar6 != uVar9);
    if (uVar7 != 0) {
      auVar13._8_4_ = (int)((ulong)lVar3 >> 0x20);
      auVar13._0_8_ = lVar3;
      auVar13._12_4_ = 0x45300000;
      uVar11 = 0;
      do {
        dVar12 = floor(((double)puVar2[uVar11] /
                       ((auVar13._8_8_ - 1.9342813113834067e+25) +
                       ((double)CONCAT44(0x43300000,(int)lVar3) - 4503599627370496.0))) *
                       ((double)(spanlen - uVar7 * intvlen) / (double)intvlen));
        uVar1 = (uint32_t)(long)dVar12;
        if (uVar11 != 0) {
          uVar1 = uVar1 + intvlen + puVar2[uVar11 - 1];
        }
        puVar2[uVar11] = uVar1;
        uVar11 = uVar11 + 1;
      } while (uVar6 != uVar11);
    }
  }
  if (order == SHUFFLE) {
    if (1 < uVar7) {
      do {
        uVar10 = (uint)(pcg32_global_0 >> 0x2d) ^ (uint)(pcg32_global_0 >> 0x1b);
        bVar4 = (byte)(pcg32_global_0 >> 0x3b);
        uVar10 = uVar10 >> bVar4 | uVar10 << 0x20 - bVar4;
        uVar8 = (ulong)uVar10;
        pcg32_global_0 = pcg32_global_0 * 0x5851f42d4c957f2d + 0xda3e39cb94b95bdb;
        uVar5 = (uint)uVar6 - 1;
        if (((uint)uVar6 & uVar5) == 0) {
          uVar8 = (ulong)(uVar10 & uVar5);
        }
        else if (uVar6 < 0x80000001) {
          uVar8 = uVar6 * uVar8;
          uVar10 = (uint)uVar8;
          if ((uVar8 & 0xffffffff) < uVar6) {
            while (uVar10 <= (uint)(0xffffffff % (uVar6 & 0xffffffff))) {
              uVar10 = (uint)(pcg32_global_0 >> 0x2d) ^ (uint)(pcg32_global_0 >> 0x1b);
              bVar4 = (byte)(pcg32_global_0 >> 0x3b);
              pcg32_global_0 = pcg32_global_0 * 0x5851f42d4c957f2d + 0xda3e39cb94b95bdb;
              uVar8 = (uVar10 >> bVar4 | uVar10 << 0x20 - bVar4) * uVar6;
              uVar10 = (uint)uVar8;
            }
          }
          uVar8 = uVar8 >> 0x20;
        }
        else {
          while (uVar6 <= uVar8) {
            uVar10 = (uint)(pcg32_global_0 >> 0x2d) ^ (uint)(pcg32_global_0 >> 0x1b);
            bVar4 = (byte)(pcg32_global_0 >> 0x3b);
            pcg32_global_0 = pcg32_global_0 * 0x5851f42d4c957f2d + 0xda3e39cb94b95bdb;
            uVar8 = (ulong)(uVar10 >> bVar4 | uVar10 << 0x20 - bVar4);
          }
        }
        uVar1 = puVar2[uVar6 - 1];
        puVar2[uVar6 - 1] = puVar2[uVar8];
        uVar6 = uVar6 - 1;
        puVar2[uVar8] = uVar1;
      } while (1 < uVar6);
    }
  }
  else if ((order == DESC) && (1 < uVar7)) {
    uVar6 = 0;
    uVar10 = uVar7;
    do {
      uVar10 = uVar10 - 1;
      uVar1 = puVar2[uVar6];
      puVar2[uVar6] = puVar2[uVar10];
      puVar2[uVar10] = uVar1;
      uVar6 = uVar6 + 1;
    } while ((uVar8 >> 1 & 0x7fffffff) != uVar6);
  }
  *offsets_out = puVar2;
  *count_out = uVar7;
  return;
}

Assistant:

void make_data(uint32_t spanlen, uint32_t intvlen, double density,
               order_t order, uint32_t **offsets_out, uint32_t *count_out) {
    uint32_t count = floor(spanlen * density / intvlen);
    uint32_t *offsets = malloc(count * sizeof(uint32_t));

    uint64_t sum = 0;
    for (uint32_t i = 0; i < count; i++) {
        offsets[i] = pcg32_random_r(&pcg32_global);
        sum += offsets[i];
    }
    for (uint32_t i = 0; i < count; i++) {
        double v = offsets[i];
        v /= sum;
        v *= (spanlen - count * intvlen) / (double)intvlen;
        uint32_t gap = floor(v);

        if (i == 0) {
            offsets[i] = gap;
        } else {
            offsets[i] = offsets[i - 1] + intvlen + gap;
        }
    }

    if (order == SHUFFLE) {
        shuffle_uint32(offsets, count);
    } else if (order == DESC) {
        for (uint32_t i = 0, j = count - 1; i < count / 2; i++, j--) {
            uint32_t tmp = offsets[i];
            offsets[i] = offsets[j];
            offsets[j] = tmp;
        }
    }

    *offsets_out = offsets;
    *count_out = count;
}